

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

void Msat_SolverAnalyze(Msat_Solver_t *p,Msat_Clause_t *pC,Msat_IntVec_t *vLits_out,int *pLevel_out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  char *pcVar6;
  int local_54;
  int iStep;
  int nLevelCur;
  int pathC;
  int j;
  int nReasonSize;
  int *pReasonArray;
  Msat_Var_t Var;
  Msat_Var_t VarQ;
  Msat_Lit_t Lit;
  Msat_Lit_t LitQ;
  int *pLevel_out_local;
  Msat_IntVec_t *vLits_out_local;
  Msat_Clause_t *pC_local;
  Msat_Solver_t *p_local;
  
  Var = -2;
  iStep = 0;
  iVar1 = Msat_IntVecReadSize(p->vTrailLim);
  iVar2 = Msat_IntVecReadSize(p->vTrail);
  p->nSeenId = p->nSeenId + 1;
  Msat_IntVecClear(vLits_out);
  Msat_IntVecPush(vLits_out,-1);
  *pLevel_out = 0;
  local_54 = iVar2 + -1;
  vLits_out_local = (Msat_IntVec_t *)pC;
  do {
    if (vLits_out_local == (Msat_IntVec_t *)0x0) {
      __assert_fail("pC != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                    ,0x1d6,
                    "void Msat_SolverAnalyze(Msat_Solver_t *, Msat_Clause_t *, Msat_IntVec_t *, int *)"
                   );
    }
    Msat_ClauseCalcReason(p,(Msat_Clause_t *)vLits_out_local,Var,p->vReason);
    iVar2 = Msat_IntVecReadSize(p->vReason);
    piVar5 = Msat_IntVecReadArray(p->vReason);
    for (nLevelCur = 0; nLevelCur < iVar2; nLevelCur = nLevelCur + 1) {
      uVar4 = piVar5[nLevelCur];
      iVar3 = (int)uVar4 >> 1;
      if (p->pSeen[iVar3] != p->nSeenId) {
        p->pSeen[iVar3] = p->nSeenId;
        Msat_SolverVarBumpActivity(p,uVar4);
        if (p->pLevel[iVar3] == iVar1) {
          iStep = iStep + 1;
        }
        else if ((0 < p->pLevel[iVar3]) &&
                (Msat_IntVecPush(vLits_out,uVar4 ^ 1), *pLevel_out < p->pLevel[iVar3])) {
          *pLevel_out = p->pLevel[iVar3];
        }
      }
    }
    do {
      iVar2 = local_54 + -1;
      Var = Msat_IntVecReadEntry(p->vTrail,local_54);
      vLits_out_local = (Msat_IntVec_t *)p->pReasons[Var >> 1];
      local_54 = iVar2;
    } while (p->pSeen[Var >> 1] != p->nSeenId);
    iStep = iStep + -1;
  } while (0 < iStep);
  Msat_IntVecWriteEntry(vLits_out,0,Var ^ 1);
  if (p->fVerbose != 0) {
    iVar1 = Msat_SolverReadDecisionLevel(p);
    uVar4 = Msat_SolverReadDecisionLevel(p);
    printf("%-*dLearnt {",(ulong)(iVar1 * 3 + 3),(ulong)uVar4);
    iVar1 = Msat_IntVecReadSize(vLits_out);
    piVar5 = Msat_IntVecReadArray(vLits_out);
    for (nLevelCur = 0; nLevelCur < iVar1; nLevelCur = nLevelCur + 1) {
      pcVar6 = "";
      if ((piVar5[nLevelCur] & 1U) != 0) {
        pcVar6 = "-";
      }
      printf(" %s%d",pcVar6,(ulong)((piVar5[nLevelCur] >> 1) + 1));
    }
    printf(" } at level %d\n",(ulong)(uint)*pLevel_out);
  }
  return;
}

Assistant:

void Msat_SolverAnalyze( Msat_Solver_t * p, Msat_Clause_t * pC, Msat_IntVec_t * vLits_out, int * pLevel_out )
{
    Msat_Lit_t LitQ, Lit = MSAT_LIT_UNASSIGNED;
    Msat_Var_t VarQ, Var;
    int * pReasonArray, nReasonSize;
    int j, pathC = 0, nLevelCur = Msat_IntVecReadSize(p->vTrailLim);
    int iStep = Msat_IntVecReadSize(p->vTrail) - 1;

    // increment the seen counter
    p->nSeenId++;
    // empty the vector array
    Msat_IntVecClear( vLits_out );
    Msat_IntVecPush( vLits_out, -1 ); // (leave room for the asserting literal)
    *pLevel_out = 0;
    do {
        assert( pC != NULL );  // (otherwise should be UIP)
        // get the reason of conflict
        Msat_ClauseCalcReason( p, pC, Lit, p->vReason );
        nReasonSize  = Msat_IntVecReadSize( p->vReason );
        pReasonArray = Msat_IntVecReadArray( p->vReason );
        for ( j = 0; j < nReasonSize; j++ ) {
            LitQ = pReasonArray[j];
            VarQ = MSAT_LIT2VAR(LitQ);
            if ( p->pSeen[VarQ] != p->nSeenId ) {
                p->pSeen[VarQ] = p->nSeenId;

                // added to better fine-tune the search
                Msat_SolverVarBumpActivity( p, LitQ );

                // skip all the literals on this decision level
                if ( p->pLevel[VarQ] == nLevelCur )
                    pathC++;
                else if ( p->pLevel[VarQ] > 0 ) { 
                    // add the literals on other decision levels but
                    // exclude variables from decision level 0
                    Msat_IntVecPush( vLits_out, MSAT_LITNOT(LitQ) );
                    if ( *pLevel_out < p->pLevel[VarQ] )
                        *pLevel_out = p->pLevel[VarQ];
                }
            }
        }
        // Select next clause to look at:
        do {
//            Lit = Msat_IntVecReadEntryLast(p->vTrail);
            Lit = Msat_IntVecReadEntry( p->vTrail, iStep-- );
            Var = MSAT_LIT2VAR(Lit);
            pC = p->pReasons[Var];
//            Msat_SolverUndoOne( p );
        } while ( p->pSeen[Var] != p->nSeenId );
        pathC--;
    } while ( pathC > 0 );
    // we do not unbind the variables above
    // this will be done after conflict analysis

    Msat_IntVecWriteEntry( vLits_out, 0, MSAT_LITNOT(Lit) );
    if ( p->fVerbose )
    {
        printf( L_IND"Learnt {", L_ind );
        nReasonSize  = Msat_IntVecReadSize( vLits_out );
        pReasonArray = Msat_IntVecReadArray( vLits_out );
        for ( j = 0; j < nReasonSize; j++ ) 
            printf(" "L_LIT, L_lit(pReasonArray[j]));
        printf(" } at level %d\n", *pLevel_out); 
    }
}